

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  Descriptor *descriptor;
  DynamicMessage *default_instance;
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  FileDescriptor *pFVar4;
  DescriptorPool *pDVar5;
  DescriptorPool *pDVar6;
  MessageFactory *pMVar7;
  undefined4 extraout_var;
  _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
  *this_00;
  TypeInfo *this_01;
  ulong uVar8;
  FieldDescriptor *field;
  int *piVar9;
  DynamicMessageFactory *this_02;
  scoped_ptr<const_google::protobuf::internal::GeneratedMessageReflection> *this_03;
  GeneratedMessageReflection *this_04;
  DescriptorPool *local_98;
  DynamicMessage *prototype;
  void *base;
  int field_size;
  int i;
  int has_bits_array_size;
  int size;
  int *offsets;
  TypeInfo *local_40;
  TypeInfo *type_info;
  TypeInfo **target;
  Descriptor *type_local;
  DynamicMessageFactory *this_local;
  
  target = (TypeInfo **)type;
  type_local = (Descriptor *)this;
  if ((this->delegate_to_generated_factory_ & 1U) != 0) {
    pFVar4 = Descriptor::file(type);
    pDVar5 = FileDescriptor::pool(pFVar4);
    pDVar6 = DescriptorPool::generated_pool();
    if (pDVar5 == pDVar6) {
      pMVar7 = MessageFactory::generated_factory();
      iVar2 = (*pMVar7->_vptr_MessageFactory[2])(pMVar7,target);
      return (Message *)CONCAT44(extraout_var,iVar2);
    }
  }
  this_00 = (_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
             *)internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::
               operator->(&this->prototypes_);
  type_info = (TypeInfo *)
              std::tr1::__detail::
              _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
              ::operator[](this_00,(Descriptor **)&target);
  if (*(mapped_type *)type_info == (mapped_type)0x0) {
    this_01 = (TypeInfo *)operator_new(0x40);
    DynamicMessage::TypeInfo::TypeInfo(this_01);
    *(TypeInfo **)type_info = this_01;
    this_01->type = (Descriptor *)target;
    local_40 = this_01;
    if (this->pool_ == (DescriptorPool *)0x0) {
      pFVar4 = Descriptor::file((Descriptor *)target);
      local_98 = FileDescriptor::pool(pFVar4);
    }
    else {
      local_98 = this->pool_;
    }
    local_40->pool = local_98;
    local_40->factory = this;
    iVar2 = Descriptor::field_count((Descriptor *)target);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2;
    uVar8 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    _has_bits_array_size = (int *)operator_new__(uVar8);
    internal::scoped_array<int>::reset(&local_40->offsets,_has_bits_array_size);
    i = 0x18;
    i = anon_unknown_0::AlignOffset(0x18);
    local_40->has_bits_offset = i;
    iVar2 = Descriptor::field_count((Descriptor *)target);
    field_size = anon_unknown_0::DivideRoundingUp(iVar2,0x20);
    i = i + field_size * 4;
    i = anon_unknown_0::AlignOffset(i);
    iVar2 = Descriptor::extension_range_count((Descriptor *)target);
    if (iVar2 < 1) {
      local_40->extensions_offset = -1;
    }
    else {
      local_40->extensions_offset = i;
      i = i + 0x30;
      i = anon_unknown_0::AlignOffset(i);
    }
    for (base._4_4_ = 0; iVar2 = base._4_4_, iVar3 = Descriptor::field_count((Descriptor *)target),
        iVar2 < iVar3; base._4_4_ = base._4_4_ + 1) {
      field = Descriptor::field((Descriptor *)target,base._4_4_);
      base._0_4_ = anon_unknown_0::FieldSpaceUsed(field);
      iVar2 = i;
      piVar9 = std::min<int>(&(anonymous_namespace)::kSafeAlignment,(int *)&base);
      iVar2 = anon_unknown_0::AlignTo(iVar2,*piVar9);
      _has_bits_array_size[base._4_4_] = iVar2;
      i = (int)base + iVar2;
    }
    iVar2 = anon_unknown_0::AlignOffset(i);
    local_40->unknown_fields_offset = iVar2;
    i = iVar2 + 8;
    i = anon_unknown_0::AlignOffset(i);
    local_40->size = i;
    this_02 = (DynamicMessageFactory *)operator_new((long)i);
    memset(this_02,0,(long)i);
    DynamicMessage::DynamicMessage((DynamicMessage *)this_02,local_40);
    local_40->prototype = (DynamicMessage *)this_02;
    this_03 = &local_40->reflection;
    this_04 = (GeneratedMessageReflection *)operator_new(0x40);
    descriptor = local_40->type;
    default_instance = local_40->prototype;
    piVar9 = internal::scoped_array<int>::get(&local_40->offsets);
    internal::GeneratedMessageReflection::GeneratedMessageReflection
              (this_04,descriptor,&default_instance->super_Message,piVar9,local_40->has_bits_offset,
               local_40->unknown_fields_offset,local_40->extensions_offset,local_40->pool,
               &this->super_MessageFactory,local_40->size);
    internal::scoped_ptr<const_google::protobuf::internal::GeneratedMessageReflection>::reset
              (this_03,this_04);
    DynamicMessage::CrossLinkPrototypes((DynamicMessage *)this_02);
    this_local = this_02;
  }
  else {
    this_local = (DynamicMessageFactory *)(*(mapped_type *)type_info)->prototype;
  }
  return (Message *)this_local;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const DynamicMessage::TypeInfo** target = &prototypes_->map_[type];
  if (*target != NULL) {
    // Already exists.
    return (*target)->prototype;
  }

  DynamicMessage::TypeInfo* type_info = new DynamicMessage::TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == NULL) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to
  // GeneratedMessageReflection's constructor.  This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.

  // Compute size and offsets.
  int* offsets = new int[type->field_count()];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = size;
  int has_bits_array_size =
    DivideRoundingUp(type->field_count(), bitsizeof(uint32));
  size += has_bits_array_size * sizeof(uint32);
  size = AlignOffset(size);

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    int field_size = FieldSpaceUsed(type->field(i));
    size = AlignTo(size, min(kSafeAlignment, field_size));
    offsets[i] = size;
    size += field_size;
  }

  // Add the UnknownFieldSet to the end.
  size = AlignOffset(size);
  type_info->unknown_fields_offset = size;
  size += sizeof(UnknownFieldSet);

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  size = AlignOffset(size);
  type_info->size = size;

  // Allocate the prototype.
  void* base = operator new(size);
  memset(base, 0, size);
  DynamicMessage* prototype = new(base) DynamicMessage(type_info);
  type_info->prototype = prototype;

  // Construct the reflection object.
  type_info->reflection.reset(
    new GeneratedMessageReflection(
      type_info->type,
      type_info->prototype,
      type_info->offsets.get(),
      type_info->has_bits_offset,
      type_info->unknown_fields_offset,
      type_info->extensions_offset,
      type_info->pool,
      this,
      type_info->size));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}